

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void av1_loop_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,int plane_start,
               int plane_end,int partial_frame,AVxWorker *workers,int num_workers,AV1LfSync *lf_sync
               ,int lpf_opt_level)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  LFWorkerData *pLVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  MACROBLOCKD *pMVar10;
  YV12_BUFFER_CONFIG *frame_buffer;
  byte bVar11;
  byte bVar12;
  int iVar13;
  AVxWorkerInterface *pAVar14;
  AV1LfMTInfo *pAVar15;
  macroblockd_plane *planes;
  long lVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  AVxWorker *pAVar25;
  long lVar26;
  bool bVar27;
  TX_SIZE tx_buf [32];
  aom_internal_error_info error_info;
  aom_internal_error_info *in_stack_fffffffffffffd30;
  uint local_29c [3];
  MACROBLOCKD *local_290;
  ulong local_288;
  AV1_COMMON *local_280;
  uint local_278;
  int local_274;
  YV12_BUFFER_CONFIG *local_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  TX_SIZE local_258 [32];
  aom_internal_error_info local_238;
  
  if ((cm->lf).filter_level[0] == 0) {
    local_29c[0] = 0;
    if ((0 < plane_start) || ((cm->lf).filter_level[1] == 0)) goto LAB_003b047f;
  }
  else {
    local_29c[0] = 0;
    if (0 < plane_start) goto LAB_003b047f;
  }
  local_29c[0] = (uint)(0 < plane_end);
LAB_003b047f:
  uVar4 = (cm->lf).filter_level_u;
  uVar5 = (cm->lf).filter_level_v;
  local_268 = ~-(uint)(uVar4 == 0 || 1 < plane_start) & -(uint)(1 < plane_end);
  uStack_260 = ~-(uint)(uVar5 == 0 || 2 < plane_start) & -(uint)(2 < plane_end);
  local_29c[1] = local_268 & 1;
  local_29c[2] = uStack_260 & 1;
  if ((byte)((plane_end < 1 || 0 < plane_start) | (byte)local_29c[0]) == 1) {
    bVar11 = (byte)local_268;
    bVar12 = (byte)uStack_260;
    if ((((byte)local_29c[0] | (byte)local_268 | (byte)uStack_260) & 1) != 0) {
      uVar22 = (cm->mi_params).mi_rows;
      if ((int)uVar22 < 9 || partial_frame == 0) {
        local_288 = 0;
        uVar24 = uVar22;
      }
      else {
        local_288 = (ulong)(uVar22 >> 1 & 0x3ffffff8);
        uVar24 = 8;
        if (0x47 < uVar22) {
          uVar24 = uVar22 >> 3;
        }
      }
      iVar13 = uVar24 + (int)local_288;
      local_290 = xd;
      local_278 = local_29c[0];
      local_270 = frame;
      uStack_264 = local_268;
      uStack_25c = uStack_260;
      av1_loop_filter_frame_init(cm,plane_start,plane_end);
      frame_buffer = local_270;
      pMVar10 = local_290;
      local_280 = cm;
      if (num_workers < 2) {
        if (0 < (int)uVar24) {
          planes = local_290->plane;
          do {
            lVar26 = 0;
            do {
              local_274 = (int)lVar26;
              if (lpf_opt_level == 2) {
                if (local_274 != 2) {
                  if (local_274 != 1) {
                    local_274 = 0;
                    uVar22 = local_278;
                    goto joined_r0x003b07da;
                  }
                  local_274 = 1;
                  if (((bVar11 | bVar12) & 1) == 0) goto LAB_003b0898;
                  goto LAB_003b07f3;
                }
              }
              else {
                uVar22 = local_29c[lVar26];
joined_r0x003b07da:
                if (uVar22 != 0) {
LAB_003b07f3:
                  iVar20 = (int)local_288;
                  av1_thread_loop_filter_rows
                            (frame_buffer,cm,planes,pMVar10,iVar20,local_274,0,lpf_opt_level,
                             (AV1LfSync *)0x0,in_stack_fffffffffffffd30,
                             (AV1_DEBLOCKING_PARAMETERS *)&local_238,local_258,5);
                  av1_thread_loop_filter_rows
                            (frame_buffer,cm,planes,pMVar10,iVar20,local_274,1,lpf_opt_level,
                             (AV1LfSync *)0x0,in_stack_fffffffffffffd30,
                             (AV1_DEBLOCKING_PARAMETERS *)&local_238,local_258,5);
                }
              }
LAB_003b0898:
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            uVar22 = (int)local_288 + 0x20;
            local_288 = (ulong)uVar22;
          } while ((int)uVar22 < iVar13);
        }
      }
      else {
        pAVar14 = aom_get_worker_interface();
        iVar20 = (cm->mi_params).mi_rows + 0x1f >> 5;
        if (((lf_sync->sync_range == 0) || (iVar20 != lf_sync->rows)) ||
           (lf_sync->num_workers < num_workers)) {
          av1_loop_filter_dealloc(lf_sync);
          av1_loop_filter_alloc(lf_sync,cm,iVar20,cm->width,num_workers);
        }
        lf_sync->lf_mt_exit = false;
        lVar26 = 6;
        do {
          memset(lf_sync->mutex_[lVar26],0xff,(long)iVar20 << 2);
          pMVar10 = local_290;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 9);
        pAVar15 = lf_sync->job_queue;
        lf_sync->jobs_enqueued = 0;
        lf_sync->jobs_dequeued = 0;
        iVar20 = 0;
        iVar21 = 0;
        bVar27 = true;
        do {
          bVar17 = bVar27;
          if (0 < (int)uVar24) {
            uVar18 = local_288 & 0xffffffff;
            do {
              lVar26 = 0;
              do {
                iVar23 = (int)lVar26;
                if (lpf_opt_level == 2) {
                  if (iVar23 != 2) {
                    uVar22 = local_29c[0];
                    if (iVar23 != 1) goto joined_r0x003b0657;
                    if (local_29c[2] == 0 && local_29c[1] == 0) goto LAB_003b0680;
                    goto LAB_003b0662;
                  }
                }
                else {
                  uVar22 = local_29c[lVar26];
joined_r0x003b0657:
                  if (uVar22 != 0) {
LAB_003b0662:
                    if (local_29c[lVar26] != 0) {
                      pAVar15->mi_row = (int)uVar18;
                      pAVar15->plane = iVar23;
                      pAVar15->dir = iVar21;
                      pAVar15->lpf_opt_level = lpf_opt_level;
                      pAVar15 = pAVar15 + 1;
                      iVar20 = iVar20 + 1;
                      lf_sync->jobs_enqueued = iVar20;
                    }
                  }
                }
LAB_003b0680:
                lVar26 = lVar26 + 1;
              } while (lVar26 != 3);
              uVar22 = (int)uVar18 + 0x20;
              uVar18 = (ulong)uVar22;
            } while ((int)uVar22 < iVar13);
          }
          iVar21 = 1;
          bVar27 = false;
        } while (bVar17);
        uVar18 = (ulong)(uint)num_workers;
        lVar26 = uVar18 * 0x2268 + -0x2248;
        uVar19 = uVar18;
        do {
          uVar1 = uVar19 - 1;
          pAVar25 = workers + uVar1;
          pLVar6 = lf_sync->lfdata;
          workers[uVar1].hook = loop_filter_row_worker;
          workers[uVar1].data1 = lf_sync;
          workers[uVar1].data2 = pLVar6 + uVar1;
          pLVar6[uVar1].frame_buffer = local_270;
          pLVar6[uVar1].cm = local_280;
          pLVar6[uVar1].xd = local_290;
          lVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)&pMVar10->plane[0].pre[-1].buf + lVar16);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            puVar2 = (undefined8 *)((long)pMVar10->plane[0].pre + lVar16 + -0x10);
            uVar9 = puVar2[1];
            puVar3 = (undefined8 *)((long)pLVar6->planes[0].pre + lVar16 + lVar26 + -0x30);
            *puVar3 = *puVar2;
            puVar3[1] = uVar9;
            puVar2 = (undefined8 *)((long)(pLVar6->planes[0].pre + -2) + lVar16 + lVar26);
            *puVar2 = uVar7;
            puVar2[1] = uVar8;
            *(undefined8 *)((long)pLVar6->planes[0].pre + lVar16 + lVar26 + -0x4c) =
                 *(undefined8 *)((long)pMVar10->plane[0].pre + lVar16 + -0x2c);
            lVar16 = lVar16 + 0xa30;
          } while (lVar16 != 0x1e90);
          pAVar25->had_error = 0;
          if (uVar1 == 0) {
            (*pAVar14->execute)(pAVar25);
            break;
          }
          (*pAVar14->launch)(pAVar25);
          lVar26 = lVar26 + -0x2268;
          bVar27 = 1 < (long)uVar19;
          uVar19 = uVar1;
        } while (bVar27);
        pAVar14 = aom_get_worker_interface();
        bVar27 = workers->had_error == 0;
        if (!bVar27) {
          memcpy(&local_238,(void *)((long)workers->data2 + 0x20c8),0x1a0);
        }
        do {
          pAVar25 = workers + (uVar18 - 1);
          uVar19 = uVar18;
          while (iVar13 = (*pAVar14->sync)(pAVar25), iVar13 != 0) {
            pAVar25 = pAVar25 + -1;
            bVar17 = uVar19 < 3;
            uVar19 = uVar19 - 1;
            if (bVar17) {
              if (bVar27) {
                return;
              }
              goto LAB_003b096e;
            }
          }
          memcpy(&local_238,(void *)((long)pAVar25->data2 + 0x20c8),0x1a0);
          uVar18 = uVar19 - 1;
          bVar27 = false;
        } while (2 < uVar19);
LAB_003b096e:
        aom_internal_error_copy(local_280->error,&local_238);
      }
    }
  }
  return;
}

Assistant:

void av1_loop_filter_frame_mt(YV12_BUFFER_CONFIG *frame, AV1_COMMON *cm,
                              MACROBLOCKD *xd, int plane_start, int plane_end,
                              int partial_frame, AVxWorker *workers,
                              int num_workers, AV1LfSync *lf_sync,
                              int lpf_opt_level) {
  int start_mi_row, end_mi_row, mi_rows_to_filter;
  int planes_to_lf[MAX_MB_PLANE];

  if (!check_planes_to_loop_filter(&cm->lf, planes_to_lf, plane_start,
                                   plane_end))
    return;

  start_mi_row = 0;
  mi_rows_to_filter = cm->mi_params.mi_rows;
  if (partial_frame && cm->mi_params.mi_rows > 8) {
    start_mi_row = cm->mi_params.mi_rows >> 1;
    start_mi_row &= 0xfffffff8;
    mi_rows_to_filter = AOMMAX(cm->mi_params.mi_rows / 8, 8);
  }
  end_mi_row = start_mi_row + mi_rows_to_filter;
  av1_loop_filter_frame_init(cm, plane_start, plane_end);

  if (num_workers > 1) {
    // Enqueue and execute loopfiltering jobs.
    loop_filter_rows_mt(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                        workers, num_workers, lf_sync, lpf_opt_level);
  } else {
    // Directly filter in the main thread.
    loop_filter_rows(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                     lpf_opt_level);
  }
}